

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.c
# Opt level: O0

void linenoiseAtExit(void)

{
  disableRawMode(0);
  freeHistory();
  return;
}

Assistant:

static void linenoiseAtExit(void) {
    disableRawMode(STDIN_FILENO);
    freeHistory();
}